

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O1

int sat_solver_clause_new(sat_solver *s,lit *begin,lit *end,int learnt)

{
  ABC_INT64_T *pAVar1;
  long *plVar2;
  veci *pvVar3;
  uint uVar4;
  uint uVar5;
  uint *puVar6;
  int *piVar7;
  int in_R8D;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  veci *pvVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  
  lVar15 = (long)end - (long)begin >> 2;
  if (lVar15 < 2) {
    __assert_fail("end - begin > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x21a,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if (1 < (uint)learnt) {
    __assert_fail("learnt >= 0 && learnt < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x21b,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  iVar14 = (int)lVar15;
  if (iVar14 == 2 && learnt == 0) {
    uVar8 = (long)*begin ^ 1;
    pvVar3 = s->wlists;
    pvVar13 = pvVar3 + uVar8;
    iVar14 = begin[1];
    uVar4 = pvVar3[uVar8].cap;
    if (pvVar3[uVar8].size == uVar4) {
      iVar12 = (uVar4 >> 1) * 3;
      if ((int)uVar4 < 4) {
        iVar12 = uVar4 * 2;
      }
      if (pvVar13->ptr == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar12 << 2);
      }
      else {
        piVar7 = (int *)realloc(pvVar13->ptr,(long)iVar12 << 2);
      }
      pvVar13->ptr = piVar7;
      if (piVar7 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pvVar13->cap * 9.5367431640625e-07,(double)iVar12 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      pvVar13->cap = iVar12;
    }
    iVar12 = pvVar13->size;
    pvVar13->size = iVar12 + 1;
    pvVar13->ptr[iVar12] = iVar14 * 2 + 1;
    uVar8 = (long)begin[1] ^ 1;
    pvVar3 = s->wlists;
    pvVar13 = pvVar3 + uVar8;
    iVar14 = *begin;
    uVar4 = pvVar3[uVar8].cap;
    if (pvVar3[uVar8].size == uVar4) {
      iVar12 = (uVar4 >> 1) * 3;
      if ((int)uVar4 < 4) {
        iVar12 = uVar4 * 2;
      }
      if (pvVar13->ptr == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar12 << 2);
      }
      else {
        piVar7 = (int *)realloc(pvVar13->ptr,(long)iVar12 << 2);
      }
      pvVar13->ptr = piVar7;
      if (piVar7 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)pvVar13->cap * 9.5367431640625e-07,(double)iVar12 * 9.5367431640625e-07);
        fflush(_stdout);
      }
      pvVar13->cap = iVar12;
    }
    iVar12 = pvVar13->size;
    pvVar13->size = iVar12 + 1;
    pvVar13->ptr[iVar12] = iVar14 * 2 + 1;
    puVar6 = &(s->stats).clauses;
    *puVar6 = *puVar6 + 1;
    pAVar1 = &(s->stats).clauses_literals;
    *pAVar1 = *pAVar1 + 2;
    return 0;
  }
  uVar4 = Sat_MemAppend(&s->Mem,begin,iVar14,learnt,in_R8D);
  if ((uVar4 & 1) != 0) {
    __assert_fail("!(h & 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x22b,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if ((learnt != 0) && (s->hLearnts == -1)) {
    s->hLearnts = uVar4;
  }
  if (learnt == 0) {
    puVar6 = &(s->stats).clauses;
    *puVar6 = *puVar6 + 1;
    lVar15 = 0x1c0;
    goto LAB_00549da0;
  }
  uVar9 = 0;
  if (uVar4 == 0) {
    puVar6 = (uint *)0x0;
  }
  else {
    uVar5 = (s->Mem).uPageMask & uVar4;
    if (uVar5 == 0) {
      __assert_fail("k",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satClause.h"
                    ,0x61,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
    }
    puVar6 = (uint *)((s->Mem).pPages[(int)uVar4 >> ((byte)(s->Mem).nPageSize & 0x1f)] + (int)uVar5)
    ;
  }
  uVar5 = *puVar6;
  if (0x7ff < uVar5) {
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    do {
      uVar11 = 1 << ((byte)s->levels[(int)puVar6[uVar8 + 1] >> 1] & 0x1f);
      bVar16 = (uVar10 >> (s->levels[(int)puVar6[uVar8 + 1] >> 1] & 0x1fU) & 1) != 0;
      if (bVar16) {
        uVar11 = 0;
      }
      uVar9 = (uVar9 + 1) - (uint)bVar16;
      uVar10 = uVar10 | uVar11;
      uVar8 = uVar8 + 1;
    } while (uVar5 >> 0xb != uVar8);
    uVar9 = (uVar9 & 0xff) << 3;
  }
  *puVar6 = uVar5 & 0xfffff807 | uVar9;
  uVar9 = (s->act_clas).size;
  if (puVar6[(ulong)(uVar5 >> 0xb) + 1] != uVar9) {
    __assert_fail("clause_id(c) == veci_size(&s->act_clas)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x232,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if (s->ClaActType == 0) {
    uVar10 = (s->act_clas).cap;
    uVar5 = 0x400;
    if (uVar9 == uVar10) {
      iVar12 = (uVar10 >> 1) * 3;
      if ((int)uVar10 < 4) {
        iVar12 = uVar10 * 2;
      }
      piVar7 = (s->act_clas).ptr;
      if (piVar7 == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar12 << 2);
      }
      else {
        piVar7 = (int *)realloc(piVar7,(long)iVar12 << 2);
      }
      (s->act_clas).ptr = piVar7;
      uVar5 = 0x400;
      goto joined_r0x00549f8e;
    }
  }
  else {
    uVar5 = s->cla_inc;
    uVar10 = (s->act_clas).cap;
    if (uVar9 == uVar10) {
      iVar12 = (uVar10 >> 1) * 3;
      if ((int)uVar10 < 4) {
        iVar12 = uVar10 * 2;
      }
      piVar7 = (s->act_clas).ptr;
      if (piVar7 == (int *)0x0) {
        piVar7 = (int *)malloc((long)iVar12 << 2);
      }
      else {
        piVar7 = (int *)realloc(piVar7,(long)iVar12 << 2);
      }
      (s->act_clas).ptr = piVar7;
joined_r0x00549f8e:
      if (piVar7 == (int *)0x0) {
        printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
               (double)(s->act_clas).cap * 9.5367431640625e-07,(double)iVar12 * 9.5367431640625e-07)
        ;
        fflush(_stdout);
      }
      (s->act_clas).cap = iVar12;
    }
  }
  iVar12 = (s->act_clas).size;
  (s->act_clas).size = iVar12 + 1;
  (s->act_clas).ptr[iVar12] = uVar5;
  puVar6 = &(s->stats).learnts;
  *puVar6 = *puVar6 + 1;
  lVar15 = 0x1c8;
LAB_00549da0:
  plVar2 = (long *)((long)(s->Mem).nEntries + lVar15 + -0x10);
  *plVar2 = *plVar2 + (long)(int)((ulong)((long)end - (long)begin) >> 2);
  uVar9 = *begin;
  if ((int)uVar9 < 0) {
    __assert_fail("begin[0] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x242,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  iVar12 = s->size * 2;
  if (iVar12 <= (int)uVar9) {
    __assert_fail("begin[0] < s->size*2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x243,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  uVar5 = begin[1];
  if ((int)uVar5 < 0) {
    __assert_fail("begin[1] >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x244,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  if ((int)uVar5 < iVar12) {
    uVar8 = (ulong)uVar9 ^ 1;
    if (iVar12 <= (int)uVar8) {
      __assert_fail("lit_neg(begin[0]) < s->size*2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x247,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
    }
    if ((int)(uVar5 ^ 1) < iVar12) {
      pvVar13 = s->wlists;
      uVar9 = uVar5 * 2 + 1;
      if (2 < iVar14) {
        uVar9 = uVar4;
      }
      pvVar3 = pvVar13 + uVar8;
      uVar5 = pvVar13[uVar8].cap;
      if (pvVar13[uVar8].size == uVar5) {
        iVar12 = (uVar5 >> 1) * 3;
        if ((int)uVar5 < 4) {
          iVar12 = uVar5 * 2;
        }
        if (pvVar3->ptr == (int *)0x0) {
          piVar7 = (int *)malloc((long)iVar12 << 2);
        }
        else {
          piVar7 = (int *)realloc(pvVar3->ptr,(long)iVar12 << 2);
        }
        pvVar3->ptr = piVar7;
        if (piVar7 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)pvVar3->cap * 9.5367431640625e-07,(double)iVar12 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        pvVar3->cap = iVar12;
      }
      iVar12 = pvVar3->size;
      pvVar3->size = iVar12 + 1;
      pvVar3->ptr[iVar12] = uVar9;
      pvVar13 = s->wlists + ((long)begin[1] ^ 1);
      uVar9 = uVar4;
      if (iVar14 < 3) {
        uVar9 = *begin * 2 + 1;
      }
      uVar5 = pvVar13->cap;
      if (pvVar13->size == uVar5) {
        iVar14 = (uVar5 >> 1) * 3;
        if ((int)uVar5 < 4) {
          iVar14 = uVar5 * 2;
        }
        if (pvVar13->ptr == (int *)0x0) {
          piVar7 = (int *)malloc((long)iVar14 << 2);
        }
        else {
          piVar7 = (int *)realloc(pvVar13->ptr,(long)iVar14 << 2);
        }
        pvVar13->ptr = piVar7;
        if (piVar7 == (int *)0x0) {
          printf("Failed to realloc memory from %.1f MB to %.1f MB.\n",
                 (double)pvVar13->cap * 9.5367431640625e-07,(double)iVar14 * 9.5367431640625e-07);
          fflush(_stdout);
        }
        pvVar13->cap = iVar14;
      }
      iVar14 = pvVar13->size;
      pvVar13->size = iVar14 + 1;
      pvVar13->ptr[iVar14] = uVar9;
      return uVar4;
    }
    __assert_fail("lit_neg(begin[1]) < s->size*2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                  ,0x248,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
  }
  __assert_fail("begin[1] < s->size*2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                ,0x245,"int sat_solver_clause_new(sat_solver *, lit *, lit *, int)");
}

Assistant:

int sat_solver_clause_new(sat_solver* s, lit* begin, lit* end, int learnt)
{
    int fUseBinaryClauses = 1;
    int size;
    clause* c;
    int h;

    assert(end - begin > 1);
    assert(learnt >= 0 && learnt < 2);
    size           = end - begin;

    // do not allocate memory for the two-literal problem clause
    if ( fUseBinaryClauses && size == 2 && !learnt )
    {
        veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),(clause_from_lit(begin[1])));
        veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),(clause_from_lit(begin[0])));
        s->stats.clauses++;
        s->stats.clauses_literals += size;
        return 0;
    }

    // create new clause
//    h = Vec_SetAppend( &s->Mem, NULL, size + learnt + 1 + 1 ) << 1;
    h = Sat_MemAppend( &s->Mem, begin, size, learnt, 0 );
    assert( !(h & 1) );
    if ( s->hLearnts == -1 && learnt )
        s->hLearnts = h;
    if (learnt)
    {
        c = clause_read( s, h );
        c->lbd = sat_clause_compute_lbd( s, c );
        assert( clause_id(c) == veci_size(&s->act_clas) );
//        veci_push(&s->learned, h);
//        act_clause_bump(s,clause_read(s, h));
        if ( s->ClaActType == 0 )
            veci_push(&s->act_clas, (1<<10));
        else
            veci_push(&s->act_clas, s->cla_inc);
        s->stats.learnts++;
        s->stats.learnts_literals += size;
    }
    else
    {
        s->stats.clauses++;
        s->stats.clauses_literals += size;
    }

    assert(begin[0] >= 0);
    assert(begin[0] < s->size*2);
    assert(begin[1] >= 0);
    assert(begin[1] < s->size*2);

    assert(lit_neg(begin[0]) < s->size*2);
    assert(lit_neg(begin[1]) < s->size*2);

    //veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),c);
    //veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),c);
    veci_push(sat_solver_read_wlist(s,lit_neg(begin[0])),(size > 2 ? h : clause_from_lit(begin[1])));
    veci_push(sat_solver_read_wlist(s,lit_neg(begin[1])),(size > 2 ? h : clause_from_lit(begin[0])));

    return h;
}